

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# puppet.hpp
# Opt level: O1

void __thiscall henson::Puppet::load(Puppet *this,ProcMap *procmap,NameMap *namemap)

{
  void *lib;
  _func_int_int_char_ptr_ptr *p_Var1;
  _func_void_void_ptr_void_ptr *p_Var2;
  _func_void_void_ptr *p_Var3;
  _func_void_int_ptr *p_Var4;
  runtime_error *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v8::basic_format_context<fmt::v8::appender,_char>_>_2
  in_R9;
  string_view fmt;
  format_args args;
  pointer local_78;
  size_type sStack_70;
  undefined8 local_68;
  string local_50;
  
  lib = (void *)dlopen((this->filename_)._M_dataplus._M_p,1);
  this->lib_ = lib;
  if (lib != (void *)0x0) {
    p_Var1 = __henson__Puppet__get_function<int(*)(int,char**)>_void__char_const___(this,lib,"main")
    ;
    this->main_ = p_Var1;
    p_Var2 = __henson__Puppet__get_function<void(*)(void*,void*)>_void__char_const___
                       (this,lib,"henson_set_contexts");
    (*p_Var2)(&(this->super_Coroutine<henson::Puppet>).from_,
              &(this->super_Coroutine<henson::Puppet>).to_);
    p_Var3 = __henson__Puppet__get_function<void(*)(void*)>_void__char_const___
                       (this,lib,"henson_set_procmap");
    (*p_Var3)(procmap);
    p_Var4 = __henson__Puppet__get_function<void(*)(int*)>_void__char_const___
                       (this,lib,"henson_set_stop");
    (*p_Var4)(&(this->super_Coroutine<henson::Puppet>).super_BaseCoroutine.stop_);
    p_Var3 = __henson__Puppet__get_function<void(*)(void*)>_void__char_const___
                       (this,lib,"henson_set_namemap");
    (*p_Var3)(namemap);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_68 = dlerror();
  local_78 = (this->filename_)._M_dataplus._M_p;
  sStack_70 = (this->filename_)._M_string_length;
  fmt.size_ = 0xcd;
  fmt.data_ = (char *)0x15;
  args.field_1.args_ = in_R9.args_;
  args.desc_ = (unsigned_long_long)&local_78;
  ::fmt::v8::vformat_abi_cxx11_(&local_50,(v8 *)"Could not load {}\n{}\n",fmt,args);
  std::runtime_error::runtime_error(this_00,(string *)&local_50);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void                load(ProcMap* procmap, NameMap* namemap)
                        {
                            void* lib = dlopen(filename_.c_str(), RTLD_LAZY);
                            lib_ = lib;
                            if (lib == NULL)
                                throw std::runtime_error(fmt::format("Could not load {}\n{}\n", filename_, dlerror()));

                            main_ = get_function<MainType>(lib, "main");

                            get_function<SetContextType>(lib, "henson_set_contexts")(&from_, &to_);
                            get_function<SetProcMapType>(lib, "henson_set_procmap")(procmap);
                            get_function<SetStopType>   (lib, "henson_set_stop")(&stop_);

                            try
                            {
                                get_function<SetNameMapType>(lib, "henson_set_namemap")(namemap);
                            } catch(std::runtime_error& e)
                            {
                                // it's a weird situation, but possible if the puppet doesn't need to get any data in or out
                                // (the linker may choose not to pull src/data.cpp and so henson_set_namemap will be missing)
                                log_->warn("{} | Reasonable only if {} doesn't need to exchange any data", e.what(), filename_);
                            }
                        }